

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_tri_fitness(REF_NODE ref_node,REF_INT *nodes,REF_DBL *fitness)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  REF_DBL r13 [3];
  REF_DBL r12 [3];
  REF_DBL e20 [3];
  REF_DBL rhy [3];
  REF_DBL e12 [3];
  REF_DBL e01 [3];
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [4];
  double local_28 [4];
  
  *fitness = -1.0;
  pRVar4 = ref_node->real;
  iVar1 = nodes[1];
  iVar2 = *nodes;
  iVar3 = nodes[2];
  lVar13 = 0;
  do {
    dVar15 = *(double *)((long)pRVar4 + lVar13 + (long)iVar1 * 0x78);
    dVar17 = *(double *)((long)pRVar4 + lVar13 + (long)iVar2 * 0x78);
    *(double *)((long)local_28 + lVar13) = dVar15 - dVar17;
    dVar18 = *(double *)((long)pRVar4 + lVar13 + (long)iVar3 * 0x78);
    *(double *)((long)local_48 + lVar13) = dVar18 - dVar15;
    *(double *)((long)local_88 + lVar13) = dVar17 - dVar18;
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x18);
  lVar13 = 0xffffffff;
  dVar15 = local_48[2] * local_48[2] + local_48[0] * local_48[0] + local_48[1] * local_48[1];
  dVar17 = local_28[2] * local_28[2] + local_28[0] * local_28[0] + local_28[1] * local_28[1];
  if (dVar17 <= dVar15) {
    dVar18 = local_88[2] * local_88[2] + local_88[0] * local_88[0] + local_88[1] * local_88[1];
    bVar6 = true;
    if (dVar18 <= dVar15) {
      bVar6 = false;
      lVar13 = 0;
    }
  }
  else {
    dVar18 = local_88[2] * local_88[2] + local_88[0] * local_88[0] + local_88[1] * local_88[1];
    bVar6 = true;
  }
  uVar12 = (uint)(byte)~(dVar17 <= dVar18 && dVar15 <= dVar18);
  lVar14 = 2;
  if (!bVar6) {
    lVar14 = lVar13;
  }
  bVar8 = dVar17 > dVar18;
  bVar9 = dVar15 > dVar18;
  lVar13 = 1;
  if (bVar8 || bVar9) {
    lVar13 = lVar14;
  }
  uVar11 = (ulong)(bVar6 ^ 1);
  uVar7 = 2;
  if (!bVar8 && !bVar9) {
    uVar11 = 2;
    uVar7 = uVar12;
  }
  if (bVar6 != false) {
    uVar7 = uVar12;
  }
  iVar1 = nodes[uVar7];
  iVar2 = nodes[uVar11];
  iVar3 = nodes[lVar13];
  lVar13 = 0;
  do {
    dVar15 = pRVar4[(long)iVar2 * 0xf + lVar13];
    local_a8[lVar13] = pRVar4[(long)iVar1 * 0xf + lVar13] - dVar15;
    local_c8[lVar13] = pRVar4[(long)iVar3 * 0xf + lVar13] - dVar15;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  dVar15 = local_a8[2] * local_a8[2] + local_a8[0] * local_a8[0] + local_a8[1] * local_a8[1];
  auVar20._0_8_ = dVar15 * 1e+20;
  dVar17 = local_a8[2] * local_c8[2] + local_a8[0] * local_c8[0] + local_a8[1] * local_c8[1];
  auVar20._8_8_ = dVar17;
  auVar21._8_8_ = -dVar17;
  auVar21._0_8_ = -auVar20._0_8_;
  auVar21 = maxpd(auVar20,auVar21);
  if (auVar21._0_8_ <= auVar21._8_8_) {
    uVar10 = 0x9a5;
  }
  else {
    dVar17 = dVar17 / dVar15;
    lVar13 = 0;
    do {
      local_68[lVar13] = local_a8[lVar13] * -dVar17 + local_c8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    dVar18 = SQRT(local_68[2] * local_68[2] + local_68[0] * local_68[0] + local_68[1] * local_68[1])
    ;
    dVar16 = dVar18 * 1e+20;
    dVar15 = (-dVar17 * dVar17 + dVar17) * SQRT(dVar15) * 0.5;
    auVar19._8_8_ = dVar15;
    auVar19._0_8_ = dVar16;
    auVar5._8_8_ = -dVar15;
    auVar5._0_8_ = -dVar16;
    auVar21 = maxpd(auVar19,auVar5);
    if (auVar21._8_8_ < auVar21._0_8_) {
      *fitness = dVar15 / dVar18;
      return 0;
    }
    uVar10 = 0x9b1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10,
         "ref_node_tri_fitness",4,"divide by longest edge");
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_fitness(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *fitness) {
  REF_DBL e01[3], e12[3], e20[3], r12[3], r13[3], rhy[3];
  REF_INT i, node0, node1, node2;
  REF_DBL s, num, hx, hy;

  *fitness = -1.0;

  node0 = 0;
  node1 = 1;
  node2 = 2;
  for (i = 0; i < 3; i++) {
    e01[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    e12[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node1]);
    e20[i] = ref_node_xyz(ref_node, i, nodes[node0]) -
             ref_node_xyz(ref_node, i, nodes[node2]);
  }
  node0 = 0;
  if (ref_math_dot(e12, e12) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e12, e12) >= ref_math_dot(e20, e20))
    node0 = 1;
  if (ref_math_dot(e20, e20) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e20, e20) >= ref_math_dot(e12, e12))
    node0 = 2;
  node1 = node0 + 1;
  node2 = node0 + 2;
  if (node1 > 2) node1 -= 3;
  if (node2 > 2) node2 -= 3;

  for (i = 0; i < 3; i++) {
    r12[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    r13[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
  }
  if (ref_math_divisible(ref_math_dot(r12, r13), ref_math_dot(r12, r12))) {
    s = ref_math_dot(r12, r13) / ref_math_dot(r12, r12);
  } else {
    s = 0.0;
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }
  hx = sqrt(ref_math_dot(r12, r12));
  for (i = 0; i < 3; i++) {
    rhy[i] = (r13[i] - s * r12[i]);
  }
  hy = sqrt(ref_math_dot(rhy, rhy));

  num = 0.5 * hx * (s - s * s);
  if (ref_math_divisible(num, hy)) {
    *fitness = num / hy;
  } else {
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }

  return REF_SUCCESS;
}